

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createTrianglePlane
          (SceneGraph *this,Vec3fa *p0,Vec3fa *dx,Vec3fa *dy,size_t width,size_t height,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pvVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  int iVar11;
  TriangleMeshNode *this_00;
  Vec3fa *pVVar12;
  long lVar13;
  ulong uVar14;
  size_t sVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  size_t sVar22;
  int iVar23;
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  *this_01;
  float fVar24;
  float fVar25;
  Ref<embree::SceneGraph::MaterialNode> local_58;
  long local_50;
  Node *local_48;
  ulong local_40;
  Vec3fa *local_38;
  
  local_48 = (Node *)this;
  this_00 = (TriangleMeshNode *)operator_new(0xd8);
  local_58 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_58.ptr != (MaterialNode *)0x0) {
    (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  TriangleMeshNode::TriangleMeshNode(this_00,&local_58,(BBox1f)0x3f80000000000000,1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_58.ptr != (MaterialNode *)0x0) {
    (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  pvVar3 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar16 = width + 1;
  local_50 = height + 1;
  uVar19 = local_50 * lVar16;
  uVar14 = pvVar3->size_alloced;
  uVar21 = uVar14;
  if ((uVar14 < uVar19) && (uVar21 = uVar19, uVar20 = uVar14, uVar14 != 0)) {
    do {
      uVar21 = uVar20 * 2 + (ulong)(uVar20 * 2 == 0);
      uVar20 = uVar21;
    } while (uVar21 < uVar19);
  }
  if (uVar19 < pvVar3->size_active) {
    pvVar3->size_active = uVar19;
  }
  if (uVar14 == uVar21) {
    pvVar3->size_active = uVar19;
  }
  else {
    local_38 = pvVar3->items;
    local_40 = uVar21;
    pVVar12 = (Vec3fa *)alignedMalloc(uVar21 << 4,0x10);
    pvVar3->items = pVVar12;
    if (pvVar3->size_active != 0) {
      lVar13 = 0;
      uVar14 = 0;
      do {
        puVar1 = (undefined8 *)((long)&local_38->field_0 + lVar13);
        uVar10 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pvVar3->items->field_0 + lVar13);
        *puVar2 = *puVar1;
        puVar2[1] = uVar10;
        uVar14 = uVar14 + 1;
        lVar13 = lVar13 + 0x10;
      } while (uVar14 < pvVar3->size_active);
    }
    alignedFree(local_38);
    pvVar3->size_active = uVar19;
    pvVar3->size_alloced = local_40;
  }
  this_01 = &this_00->triangles;
  std::
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  ::resize(this_01,width * height * 2);
  lVar13 = 0;
  uVar14 = 0;
  do {
    fVar24 = (float)uVar14 / (float)height;
    uVar21 = 0;
    lVar17 = lVar13;
    do {
      fVar25 = (float)uVar21 / (float)width;
      fVar4 = (dx->field_0).m128[1];
      fVar5 = (dx->field_0).m128[2];
      fVar6 = (p0->field_0).m128[1];
      fVar7 = (p0->field_0).m128[2];
      fVar8 = (dy->field_0).m128[1];
      fVar9 = (dy->field_0).m128[2];
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar17) =
           (dy->field_0).m128[0] * fVar24 + fVar25 * (dx->field_0).m128[0] + (p0->field_0).m128[0];
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar17 + 4) =
           fVar8 * fVar24 + fVar25 * fVar4 + fVar6;
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar17 + 8) =
           fVar9 * fVar24 + fVar25 * fVar5 + fVar7;
      uVar21 = uVar21 + 1;
      lVar17 = lVar17 + 0x10;
    } while (lVar16 + (ulong)(lVar16 == 0) != uVar21);
    uVar14 = uVar14 + 1;
    lVar13 = lVar13 + width * 0x10 + 0x10;
  } while (uVar14 != local_50 + (ulong)(local_50 == 0));
  if (height != 0) {
    iVar11 = (int)width + 1;
    sVar15 = 0;
    do {
      if (width != 0) {
        iVar18 = (int)sVar15 * iVar11;
        lVar16 = sVar15 * width * 0x18;
        sVar22 = width;
        iVar23 = ((int)sVar15 + 1) * iVar11;
        do {
          *(int *)((long)&((this_01->
                           super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                           )._M_impl.super__Vector_impl_data._M_start)->v0 + lVar16) = iVar18;
          iVar18 = iVar18 + 1;
          *(int *)((long)&((this_01->
                           super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                           )._M_impl.super__Vector_impl_data._M_start)->v1 + lVar16) = iVar18;
          *(int *)((long)&((this_01->
                           super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                           )._M_impl.super__Vector_impl_data._M_start)->v2 + lVar16) = iVar23;
          *(int *)((long)&(this_01->
                          super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                          )._M_impl.super__Vector_impl_data._M_start[1].v0 + lVar16) = iVar23 + 1;
          *(int *)((long)&(this_01->
                          super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                          )._M_impl.super__Vector_impl_data._M_start[1].v1 + lVar16) = iVar23;
          *(int *)((long)&(this_01->
                          super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                          )._M_impl.super__Vector_impl_data._M_start[1].v2 + lVar16) = iVar18;
          lVar16 = lVar16 + 0x18;
          sVar22 = sVar22 - 1;
          iVar23 = iVar23 + 1;
        } while (sVar22 != 0);
      }
      sVar15 = sVar15 + 1;
    } while (sVar15 != height);
  }
  (local_48->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)local_48;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createTrianglePlane (const Vec3fa& p0, const Vec3fa& dx, const Vec3fa& dy, size_t width, size_t height, Ref<MaterialNode> material)
  {
    Ref<SceneGraph::TriangleMeshNode> mesh = new SceneGraph::TriangleMeshNode(material,BBox1f(0,1),1);
    mesh->positions[0].resize((width+1)*(height+1));
    mesh->triangles.resize(2*width*height);

    for (size_t y=0; y<=height; y++) {
      for (size_t x=0; x<=width; x++) {
        Vec3fa p = p0+float(x)/float(width)*dx+float(y)/float(height)*dy;
        size_t i = y*(width+1)+x;
        mesh->positions[0][i].x = p.x;
        mesh->positions[0][i].y = p.y;
        mesh->positions[0][i].z = p.z;
      }
    }
    for (size_t y=0; y<height; y++) {
      for (size_t x=0; x<width; x++) {
        size_t i = 2*y*width+2*x;
        size_t p00 = (y+0)*(width+1)+(x+0);
        size_t p01 = (y+0)*(width+1)+(x+1);
        size_t p10 = (y+1)*(width+1)+(x+0);
        size_t p11 = (y+1)*(width+1)+(x+1);
        mesh->triangles[i+0].v0 = unsigned(p00); mesh->triangles[i+0].v1 = unsigned(p01); mesh->triangles[i+0].v2 = unsigned(p10);
        mesh->triangles[i+1].v0 = unsigned(p11); mesh->triangles[i+1].v1 = unsigned(p10); mesh->triangles[i+1].v2 = unsigned(p01);
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }